

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorykeyvaluestore.cpp
# Opt level: O0

void __thiscall
groundupdbext::MemoryKeyValueStore::setKeyValue
          (MemoryKeyValueStore *this,HashedValue *key,EncodedValue *value)

{
  EncodedValue *pEVar1;
  bool bVar2;
  pointer pIVar3;
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_> *this_00;
  pointer pKVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_false,_false>,_bool>
  pVar5;
  EncodedValue local_f8;
  _Node_iterator_base<std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_false>
  local_b8;
  undefined1 local_b0;
  pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue> local_98;
  EncodedValue *local_20;
  EncodedValue *value_local;
  HashedValue *key_local;
  MemoryKeyValueStore *this_local;
  
  local_20 = value;
  value_local = (EncodedValue *)key;
  key_local = (HashedValue *)this;
  pIVar3 = std::
           unique_ptr<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           ::operator->(&this->mImpl);
  std::
  unordered_map<groundupdb::HashedValue,_groundupdb::EncodedValue,_groundupdbext::HighwayHash,_std::equal_to<groundupdb::HashedValue>,_std::allocator<std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>_>_>
  ::erase(&pIVar3->m_keyValueStore,(key_type *)value_local);
  pIVar3 = std::
           unique_ptr<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           ::operator->(&this->mImpl);
  std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>::
  pair<groundupdb::EncodedValue_&,_true>(&local_98,(HashedValue *)value_local,local_20);
  pVar5 = std::
          unordered_map<groundupdb::HashedValue,_groundupdb::EncodedValue,_groundupdbext::HighwayHash,_std::equal_to<groundupdb::HashedValue>,_std::allocator<std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>_>_>
          ::insert(&pIVar3->m_keyValueStore,&local_98);
  local_b8._M_cur =
       (__node_type *)
       pVar5.first.
       super__Node_iterator_base<std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>,_false>
       ._M_cur;
  local_b0 = pVar5.second;
  std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>::~pair(&local_98);
  pIVar3 = std::
           unique_ptr<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           ::operator->(&this->mImpl);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&pIVar3->m_cachedStore);
  if (bVar2) {
    pIVar3 = std::
             unique_ptr<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
             ::operator->(&this->mImpl);
    this_00 = std::
              optional<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>_>
              ::operator->(&pIVar3->m_cachedStore);
    pKVar4 = std::
             unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
             ::get(this_00);
    pEVar1 = value_local;
    groundupdb::EncodedValue::EncodedValue(&local_f8,local_20);
    (*(pKVar4->super_Store)._vptr_Store[2])(pKVar4,pEVar1,&local_f8);
    groundupdb::EncodedValue::~EncodedValue(&local_f8);
  }
  return;
}

Assistant:

void
MemoryKeyValueStore::setKeyValue(const HashedValue& key,EncodedValue&& value)
{
  // Also write to our in-memory unordered map
  // Note: insert on unordered_map does NOT perform an insert if the key already exists
  mImpl->m_keyValueStore.erase(key);
  mImpl->m_keyValueStore.insert({key,value});
  if (mImpl->m_cachedStore) {
    mImpl->m_cachedStore->get()->setKeyValue(key,EncodedValue(value)); // force copy construction of a temporary
  }
}